

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O0

int __thiscall QtMWidgets::PageControlPrivate::findButton(PageControlPrivate *this,QPoint *pos)

{
  reference pQVar1;
  ulong uVar2;
  int local_24;
  int i;
  QPoint *pos_local;
  PageControlPrivate *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->count <= local_24) {
      return -1;
    }
    pQVar1 = QList<QRect>::operator[](&this->rectangles,(long)local_24);
    uVar2 = QRect::contains((QPoint *)pQVar1,SUB81(pos,0));
    if ((uVar2 & 1) != 0) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int
PageControlPrivate::findButton( const QPoint & pos )
{
	for( int i = 0; i < count; ++i )
	{
		if( rectangles[ i ].contains( pos ) )
			return i;
	}

	return -1;
}